

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_api.c
# Opt level: O0

MPP_RET free_cur_ctx(H264dCurCtx_t *p_Cur)

{
  undefined8 in_R9;
  uint local_14;
  MPP_RET ret;
  RK_U32 i;
  H264dCurCtx_t *p_Cur_local;
  
  if (p_Cur == (H264dCurCtx_t *)0x0) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0x52,in_R9,0xfffffc16);
    }
  }
  else if (p_Cur != (H264dCurCtx_t *)0x0) {
    for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
      if (p_Cur->listP[local_14] != (h264_store_pic_t **)0x0) {
        mpp_osal_free("free_cur_ctx",p_Cur->listP[local_14]);
      }
      p_Cur->listP[local_14] = (h264_store_pic_t **)0x0;
      if (p_Cur->listB[local_14] != (h264_store_pic_t **)0x0) {
        mpp_osal_free("free_cur_ctx",p_Cur->listB[local_14]);
      }
      p_Cur->listB[local_14] = (h264_store_pic_t **)0x0;
    }
    if ((p_Cur->strm).nalu_buf != (RK_U8 *)0x0) {
      mpp_osal_free("free_cur_ctx",(p_Cur->strm).nalu_buf);
    }
    (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
    if ((p_Cur->strm).head_buf != (RK_U8 *)0x0) {
      mpp_osal_free("free_cur_ctx",(p_Cur->strm).head_buf);
    }
    (p_Cur->strm).head_buf = (RK_U8 *)0x0;
    if ((p_Cur->strm).tmp_buf != (RK_U8 *)0x0) {
      mpp_osal_free("free_cur_ctx",(p_Cur->strm).tmp_buf);
    }
    (p_Cur->strm).tmp_buf = (RK_U8 *)0x0;
    for (local_14 = 0; local_14 < 0x23; local_14 = local_14 + 1) {
      if (p_Cur->dec_ref_pic_marking_buffer[local_14] != (h264_drpm_t *)0x0) {
        mpp_osal_free("free_cur_ctx",p_Cur->dec_ref_pic_marking_buffer[local_14]);
      }
      p_Cur->dec_ref_pic_marking_buffer[local_14] = (h264_drpm_t *)0x0;
    }
    if (p_Cur->subsps != (h264_subsps_t *)0x0) {
      mpp_osal_free("free_cur_ctx",p_Cur->subsps);
    }
    p_Cur->subsps = (h264_subsps_t *)0x0;
    if (p_Cur->sei != (h264_sei_t *)0x0) {
      mpp_osal_free("free_cur_ctx",p_Cur->sei);
    }
    p_Cur->sei = (h264_sei_t *)0x0;
    if (p_Cur->hdr_dynamic_meta != (MppFrameHdrDynamicMeta *)0x0) {
      mpp_osal_free("free_cur_ctx",p_Cur->hdr_dynamic_meta);
    }
    p_Cur->hdr_dynamic_meta = (MppFrameHdrDynamicMeta *)0x0;
  }
  return MPP_OK;
}

Assistant:

static MPP_RET free_cur_ctx(H264dCurCtx_t *p_Cur)
{
    RK_U32 i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;

    INP_CHECK(ret, !p_Cur);

    if (p_Cur) {
        for (i = 0; i < MAX_NUM_DPB_LAYERS; i++) {
            MPP_FREE(p_Cur->listP[i]);
            MPP_FREE(p_Cur->listB[i]);
        }
        MPP_FREE(p_Cur->strm.nalu_buf);
        MPP_FREE(p_Cur->strm.head_buf);
        MPP_FREE(p_Cur->strm.tmp_buf);

        for (i = 0; i < MAX_MARKING_TIMES; i++)
            MPP_FREE(p_Cur->dec_ref_pic_marking_buffer[i]);

        MPP_FREE(p_Cur->subsps);
        MPP_FREE(p_Cur->sei);
        MPP_FREE(p_Cur->hdr_dynamic_meta);
    }

__RETURN:
    return ret = MPP_OK;
}